

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsInterface.cpp
# Opt level: O2

void __thiscall helics::CommsInterface::setName(CommsInterface *this,string *commName)

{
  bool bVar1;
  
  bVar1 = propertyLock(this);
  if (bVar1) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->name,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)commName);
    propertyUnLock(this);
    return;
  }
  return;
}

Assistant:

void CommsInterface::setName(const std::string& commName)
{
    if (propertyLock()) {
        name = commName;
        propertyUnLock();
    }
}